

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O1

CRule * allocator_default<CTilesetMapper::CRule>::alloc_array(int size)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *this;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  uVar5 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar5 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(0x28),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar5);
  *puVar4 = uVar6;
  if (size != 0) {
    this = (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
            *)(puVar4 + 4);
    lVar7 = -8;
    do {
      this->list = (CRuleCondition *)0x0;
      array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::
      clear(this);
      this = (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
              *)&this[2].list_size;
      lVar1 = lVar7 + uVar6 * 0x28;
      lVar7 = lVar7 + -0x28;
    } while (lVar1 != 0x20);
  }
  return (CRule *)(puVar4 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }